

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::write_significand<char*,char>
                 (char *out,char *significand,int significand_size,int integral_size,
                 char decimal_point)

{
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  char *out_local;
  
  out_local = copy_str<char,_const_char_*,_char_*,_0>(significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    *out_local = decimal_point;
    out_local = copy_str<char,_const_char_*,_char_*,_0>
                          (significand + integral_size,significand + significand_size,out_local + 1)
    ;
  }
  return out_local;
}

Assistant:

inline OutputIt write_significand(OutputIt out, const char* significand,
                                  int significand_size, int integral_size,
                                  Char decimal_point) {
  out = detail::copy_str<Char>(significand, significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str<Char>(significand + integral_size,
                                significand + significand_size, out);
}